

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressSeqStore_singleBlock
                 (ZSTD_CCtx *zc,seqStore_t *seqStore,repcodes_t *dRep,repcodes_t *cRep,void *dst,
                 size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock,U32 isPartition)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  uint uVar6;
  seqDef *psVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  int iVar9;
  bool bVar10;
  U32 UVar11;
  uint uVar12;
  U32 UVar13;
  U32 UVar14;
  uint uVar15;
  U32 *pUVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  size_t err_code;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int in_stack_ffffffffffffff80;
  BYTE *op;
  repcodes_t dRepOriginal;
  
  dRepOriginal.rep[2] = dRep->rep[2];
  dRepOriginal.rep._0_8_ = *(undefined8 *)dRep->rep;
  if (isPartition != 0) {
    psVar7 = seqStore->sequencesStart;
    uVar17 = (ulong)((long)seqStore->sequences - (long)psVar7) >> 3;
    uVar19 = (uint)uVar17;
    UVar11 = uVar19;
    if (seqStore->longLengthType == ZSTD_llt_literalLength) {
      UVar11 = seqStore->longLengthPos;
    }
    if (uVar19 != 0) {
      uVar18 = 0;
      do {
        bVar20 = psVar7[uVar18].litLength == 0;
        bVar10 = UVar11 != uVar18 && bVar20;
        uVar6 = psVar7[uVar18].offBase;
        uVar19 = uVar6 - 1;
        uVar15 = uVar6;
        if (uVar19 < 3) {
          uVar12 = uVar19 + bVar10;
          if (uVar12 == 3) {
            UVar13 = dRep->rep[0] - 1;
            UVar14 = cRep->rep[0] - 1;
          }
          else {
            UVar13 = dRep->rep[uVar12];
            UVar14 = cRep->rep[uVar12];
          }
          if (UVar13 != UVar14) {
            uVar15 = UVar14 + 3;
            psVar7[uVar18].offBase = uVar15;
            goto LAB_018b5f05;
          }
LAB_018b5f1b:
          uVar15 = uVar15 - (UVar11 == uVar18 || !bVar20);
          if (uVar15 != 0) {
            if (uVar15 == 3) {
              UVar14 = dRep->rep[0];
              UVar13 = UVar14 - 1;
            }
            else {
              UVar13 = dRep->rep[uVar15];
              UVar14 = dRep->rep[0];
            }
            pUVar16 = dRep->rep + 1;
            if (uVar15 == 1) {
              pUVar16 = dRep->rep + 2;
            }
            dRep->rep[2] = *pUVar16;
            dRep->rep[1] = UVar14;
            goto LAB_018b5f51;
          }
        }
        else {
LAB_018b5f05:
          if (uVar15 < 4) goto LAB_018b5f1b;
          *(undefined8 *)(dRep->rep + 1) = *(undefined8 *)dRep->rep;
          UVar13 = uVar15 - 3;
LAB_018b5f51:
          dRep->rep[0] = UVar13;
        }
        if (uVar6 < 4) {
          uVar19 = uVar19 + bVar10;
          if (uVar19 != 0) {
            if (uVar19 == 3) {
              UVar14 = cRep->rep[0];
              UVar13 = UVar14 - 1;
            }
            else {
              UVar13 = cRep->rep[uVar19];
              UVar14 = cRep->rep[0];
            }
            pUVar16 = cRep->rep + 1;
            if (uVar19 == 1) {
              pUVar16 = cRep->rep + 2;
            }
            cRep->rep[2] = *pUVar16;
            cRep->rep[1] = UVar14;
            goto LAB_018b5fa1;
          }
        }
        else {
          *(undefined8 *)(cRep->rep + 1) = *(undefined8 *)cRep->rep;
          UVar13 = uVar6 - 3;
LAB_018b5fa1:
          cRep->rep[0] = UVar13;
        }
        uVar18 = uVar18 + 1;
      } while ((uVar17 & 0xffffffff) != uVar18);
    }
  }
  uVar17 = 0xffffffffffffffba;
  if (2 < dstCapacity) {
    uVar17 = ZSTD_entropyCompressSeqStore
                       (seqStore,&((zc->blockState).prevCBlock)->entropy,
                        &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                        (void *)((long)dst + 3),dstCapacity - 3,srcSize,zc->entropyWorkspace,
                        (ulong)(uint)zc->bmi2,in_stack_ffffffffffffff80);
    if (uVar17 < 0xffffffffffffff89) {
      if (((uVar17 < 0x19) && (zc->isFirstBlock == 0)) &&
         (iVar9 = ZSTD_isRLE((BYTE *)src,srcSize), iVar9 != 0)) {
        uVar17 = 1;
      }
      if ((zc->seqCollector).collectSequences == 0) {
        if (uVar17 == 1) {
          if (dstCapacity == 3) {
            return 0xffffffffffffffba;
          }
          uVar5 = *src;
          iVar9 = lastBlock + (int)srcSize * 8 + 2;
          *(short *)dst = (short)iVar9;
          *(char *)((long)dst + 2) = (char)((uint)iVar9 >> 0x10);
          *(undefined1 *)((long)dst + 3) = uVar5;
          dRep->rep[2] = dRepOriginal.rep[2];
          *(undefined8 *)dRep->rep = dRepOriginal.rep._0_8_;
          uVar17 = 4;
        }
        else if (uVar17 == 0) {
          uVar17 = srcSize + 3;
          if (dstCapacity < uVar17) {
            return 0xffffffffffffffba;
          }
          iVar9 = lastBlock + (int)srcSize * 8;
          *(short *)dst = (short)iVar9;
          *(char *)((long)dst + 2) = (char)((uint)iVar9 >> 0x10);
          switchD_012b9b0d::default((void *)((long)dst + 3),src,srcSize);
          if (0xffffffffffffff88 < uVar17) {
            return uVar17;
          }
          dRep->rep[2] = dRepOriginal.rep[2];
          *(undefined8 *)dRep->rep = dRepOriginal.rep._0_8_;
        }
        else {
          uVar2 = (zc->blockState).prevCBlock;
          uVar4 = (zc->blockState).nextCBlock;
          auVar22._8_4_ = (int)uVar2;
          auVar22._0_8_ = uVar4;
          auVar22._12_4_ = (int)((ulong)uVar2 >> 0x20);
          (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar4;
          (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar22._8_8_;
          iVar9 = lastBlock + (int)uVar17 * 8 + 4;
          *(short *)dst = (short)iVar9;
          *(char *)((long)dst + 2) = (char)((uint)iVar9 >> 0x10);
          uVar17 = uVar17 + 3;
        }
        pZVar8 = (zc->blockState).prevCBlock;
        if ((pZVar8->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
          (pZVar8->entropy).fse.offcode_repeatMode = FSE_repeat_check;
        }
      }
      else {
        uVar17 = ZSTD_copyBlockSequences(&zc->seqCollector,seqStore,dRepOriginal.rep);
        if (uVar17 < 0xffffffffffffff89) {
          uVar1 = (zc->blockState).prevCBlock;
          uVar3 = (zc->blockState).nextCBlock;
          auVar21._8_4_ = (int)uVar1;
          auVar21._0_8_ = uVar3;
          auVar21._12_4_ = (int)((ulong)uVar1 >> 0x20);
          (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
          (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar21._8_8_;
          uVar17 = 0;
        }
      }
    }
  }
  return uVar17;
}

Assistant:

static size_t
ZSTD_compressSeqStore_singleBlock(ZSTD_CCtx* zc,
                            const seqStore_t* const seqStore,
                                  repcodes_t* const dRep, repcodes_t* const cRep,
                                  void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize,
                                  U32 lastBlock, U32 isPartition)
{
    const U32 rleMaxLength = 25;
    BYTE* op = (BYTE*)dst;
    const BYTE* ip = (const BYTE*)src;
    size_t cSize;
    size_t cSeqsSize;

    /* In case of an RLE or raw block, the simulated decompression repcode history must be reset */
    repcodes_t const dRepOriginal = *dRep;
    DEBUGLOG(5, "ZSTD_compressSeqStore_singleBlock");
    if (isPartition)
        ZSTD_seqStore_resolveOffCodes(dRep, cRep, seqStore, (U32)(seqStore->sequences - seqStore->sequencesStart));

    RETURN_ERROR_IF(dstCapacity < ZSTD_blockHeaderSize, dstSize_tooSmall, "Block header doesn't fit");
    cSeqsSize = ZSTD_entropyCompressSeqStore(seqStore,
                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                &zc->appliedParams,
                op + ZSTD_blockHeaderSize, dstCapacity - ZSTD_blockHeaderSize,
                srcSize,
                zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                zc->bmi2);
    FORWARD_IF_ERROR(cSeqsSize, "ZSTD_entropyCompressSeqStore failed!");

    if (!zc->isFirstBlock &&
        cSeqsSize < rleMaxLength &&
        ZSTD_isRLE((BYTE const*)src, srcSize)) {
        /* We don't want to emit our first block as a RLE even if it qualifies because
        * doing so will cause the decoder (cli only) to throw a "should consume all input error."
        * This is only an issue for zstd <= v1.4.3
        */
        cSeqsSize = 1;
    }

    /* Sequence collection not supported when block splitting */
    if (zc->seqCollector.collectSequences) {
        FORWARD_IF_ERROR(ZSTD_copyBlockSequences(&zc->seqCollector, seqStore, dRepOriginal.rep), "copyBlockSequences failed");
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    if (cSeqsSize == 0) {
        cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "Nocompress block failed");
        DEBUGLOG(4, "Writing out nocompress block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else if (cSeqsSize == 1) {
        cSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "RLE compress block failed");
        DEBUGLOG(4, "Writing out RLE block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(op, cSeqsSize, srcSize, lastBlock);
        cSize = ZSTD_blockHeaderSize + cSeqsSize;
        DEBUGLOG(4, "Writing out compressed block, size: %zu", cSize);
    }

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}